

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O3

void qsoundc_w(void *info,UINT8 offset,UINT8 data)

{
  undefined2 *puVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,offset);
  if (iVar2 == 2) {
    puVar1 = *(undefined2 **)((long)info + (ulong)data * 8 + 0x14a0);
    if (puVar1 != (undefined2 *)0x0) {
      *puVar1 = *(undefined2 *)((long)info + 0x1c);
    }
    *(undefined1 *)((long)info + 0x149c) = 0;
    return;
  }
  if (iVar2 == 1) {
    *(UINT8 *)((long)info + 0x1c) = data;
  }
  else if (iVar2 == 0) {
    *(UINT8 *)((long)info + 0x1d) = data;
    return;
  }
  return;
}

Assistant:

static void qsoundc_w(void* info, UINT8 offset, UINT8 data)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	
	switch (offset)
	{
		case 0:
			chip->data_latch = (chip->data_latch & 0x00ff) | (data << 8);
			break;
		case 1:
			chip->data_latch = (chip->data_latch & 0xff00) | data;
			break;
		case 2:
			qsoundc_write_data(chip, data, chip->data_latch);
			break;
		default:
			break;
	}
	
	return;
}